

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O2

void compute_response_layers_at_once(fasthessian *fh)

{
  int row;
  int cols;
  int rows;
  int cols_00;
  int cols_01;
  int rows_00;
  int cols_02;
  int cols_03;
  int cols_04;
  int iVar1;
  uint uVar2;
  uint uVar3;
  response_layer *prVar4;
  response_layer *prVar5;
  response_layer *prVar6;
  response_layer *prVar7;
  response_layer *prVar8;
  response_layer *prVar9;
  response_layer *prVar10;
  response_layer *prVar11;
  bool *pbVar12;
  integral_image *iimage;
  float *pfVar13;
  bool *pbVar14;
  float *pfVar15;
  float *pfVar16;
  bool *pbVar17;
  float *pfVar18;
  bool *pbVar19;
  float *pfVar20;
  bool *pbVar21;
  float *pfVar22;
  bool *pbVar23;
  float *pfVar24;
  bool *pbVar25;
  float *pfVar26;
  bool *pbVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int rows_01;
  int rows_02;
  int rows_03;
  int cols_05;
  int rows_04;
  int rows_05;
  int rows_06;
  int rows_07;
  int cols_06;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  uint uVar38;
  int cols_07;
  uint uVar39;
  int row_00;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int cols_08;
  int row_01;
  int cols_09;
  int row_02;
  int rows_08;
  int row_03;
  int cols_10;
  int row_04;
  int cols_11;
  int row_05;
  int cols_12;
  int row_06;
  int iVar45;
  int iVar46;
  int iVar47;
  int row_07;
  int iVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  long local_368;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 extraout_var_08 [60];
  undefined1 extraout_var_09 [60];
  undefined1 extraout_var_10 [60];
  undefined1 extraout_var_11 [60];
  undefined1 extraout_var_12 [60];
  undefined1 extraout_var_13 [60];
  undefined1 extraout_var_14 [60];
  
  prVar4 = fh->response_map[0];
  prVar5 = fh->response_map[2];
  prVar6 = fh->response_map[4];
  prVar7 = fh->response_map[1];
  prVar8 = fh->response_map[3];
  prVar9 = fh->response_map[5];
  prVar10 = fh->response_map[6];
  cols = prVar4->filter_size;
  rows = prVar5->filter_size;
  cols_00 = prVar6->filter_size;
  cols_01 = prVar7->filter_size;
  rows_00 = prVar8->filter_size;
  cols_02 = prVar9->filter_size;
  prVar11 = fh->response_map[7];
  cols_03 = prVar10->filter_size;
  cols_04 = prVar11->filter_size;
  pbVar12 = prVar7->laplacian;
  iVar1 = fh->step;
  iimage = fh->iimage;
  pfVar13 = prVar7->response;
  pbVar14 = prVar5->laplacian;
  pfVar15 = prVar8->response;
  pfVar16 = prVar5->response;
  pbVar17 = prVar8->laplacian;
  uVar2 = prVar4->width;
  pfVar18 = prVar6->response;
  pbVar19 = prVar6->laplacian;
  pfVar20 = prVar9->response;
  pbVar21 = prVar9->laplacian;
  pfVar22 = prVar10->response;
  pbVar23 = prVar10->laplacian;
  pfVar24 = prVar11->response;
  pbVar25 = prVar11->laplacian;
  pfVar26 = prVar4->response;
  pbVar27 = prVar4->laplacian;
  uVar3 = prVar4->height;
  cols_07 = cols / 3;
  cols_08 = cols_01 / 3;
  cols_09 = rows / 3;
  rows_08 = rows_00 / 3;
  cols_10 = cols_00 / 3;
  cols_11 = cols_02 / 3;
  cols_12 = cols_03 / 3;
  cols_06 = cols_04 / 3;
  iVar31 = (cols + -1) / 2;
  fVar49 = 1.0 / (float)(cols * cols);
  fVar70 = 1.0 / (float)(cols_01 * cols_01);
  fVar71 = 1.0 / (float)(rows * rows);
  fVar72 = 1.0 / (float)(rows_00 * rows_00);
  fVar73 = 1.0 / (float)(cols_00 * cols_00);
  fVar74 = 1.0 / (float)(cols_02 * cols_02);
  fVar75 = 1.0 / (float)(cols_03 * cols_03);
  fVar76 = 1.0 / (float)(cols_04 * cols_04);
  iVar32 = (cols_01 + -1) / 2;
  iVar46 = (rows + -1) / 2;
  iVar33 = (rows_00 + -1) / 2;
  iVar34 = (cols_00 + -1) / 2;
  iVar45 = (cols_02 + -1) / 2;
  iVar43 = (cols_03 + -1) / 2;
  iVar35 = (cols_04 + -1) / 2;
  local_368 = 0;
  iVar41 = 0;
  iVar42 = 0;
  rows_01 = cols_07 * 2 + -1;
  rows_02 = cols_08 * 2 + -1;
  rows_03 = cols_09 * 2 + -1;
  cols_05 = rows_08 * 2 + -1;
  rows_04 = cols_10 * 2 + -1;
  rows_05 = cols_11 * 2 + -1;
  rows_06 = cols_12 * 2 + -1;
  rows_07 = cols_06 * 2 + -1;
  for (uVar38 = 0; uVar38 != (~((int)uVar3 >> 0x1f) & uVar3); uVar38 = uVar38 + 1) {
    iVar36 = uVar38 * iVar1;
    iVar47 = 0;
    row_01 = iVar36 - cols_07;
    row = iVar36 + 1;
    row_02 = iVar36 - cols_08;
    row_03 = iVar36 - cols_09;
    row_07 = iVar36 - cols_06;
    row_04 = iVar36 - rows_08;
    row_05 = iVar36 - cols_10;
    row_06 = iVar36 - cols_11;
    row_00 = iVar36 - cols_12;
    local_368 = (long)(int)local_368;
    for (lVar37 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != (uint)lVar37; lVar37 = lVar37 + 1) {
      fVar50 = box_integral(iimage,row_01 + 1,iVar47 - iVar31,rows_01,cols);
      auVar54._0_4_ = box_integral(iimage,row_01 + 1,iVar47 - cols / 6,rows_01,cols_07);
      auVar54._4_60_ = extraout_var;
      auVar28 = vfmadd132ss_fma(auVar54._0_16_,ZEXT416((uint)fVar50),ZEXT416(0xc0400000));
      iVar44 = -cols_07 + 1 + iVar47;
      iVar40 = -cols_07 + iVar47;
      fVar50 = box_integral(iimage,iVar36 - iVar31,iVar44,cols,rows_01);
      auVar55._0_4_ = box_integral(iimage,iVar36 - cols / 6,iVar44,cols_07,rows_01);
      auVar55._4_60_ = extraout_var_00;
      iVar44 = iVar47 + 1;
      auVar29 = vfmadd132ss_fma(auVar55._0_16_,ZEXT416((uint)fVar50),ZEXT416(0xc0400000));
      fVar51 = box_integral(iimage,row_01,iVar44,cols_07,cols_07);
      fVar52 = box_integral(iimage,row,iVar40,cols_07,cols_07);
      fVar53 = box_integral(iimage,row_01,iVar40,cols_07,cols_07);
      fVar50 = box_integral(iimage,row,iVar44,cols_07,cols_07);
      fVar50 = ((fVar52 + fVar51) - fVar53) - fVar50;
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar50 * -0.81)),
                                ZEXT416((uint)auVar28._0_4_),ZEXT416((uint)auVar29._0_4_));
      pfVar26[local_368 + lVar37] = auVar30._0_4_ * fVar49 * fVar49;
      pbVar27[lVar37 + local_368] = 0.0 <= auVar28._0_4_ + auVar29._0_4_;
      fVar50 = box_integral(iimage,row_02 + 1,iVar47 - iVar32,rows_02,cols_01);
      auVar56._0_4_ = box_integral(iimage,row_02 + 1,iVar47 - cols_01 / 6,rows_02,cols_08);
      auVar56._4_60_ = extraout_var_01;
      auVar28 = vfmadd132ss_fma(auVar56._0_16_,ZEXT416((uint)fVar50),ZEXT416(0xc0400000));
      iVar48 = -cols_08 + 1 + iVar47;
      iVar40 = -cols_08 + iVar47;
      fVar50 = box_integral(iimage,iVar36 - iVar32,iVar48,cols_01,rows_02);
      auVar57._0_4_ = box_integral(iimage,iVar36 - cols_01 / 6,iVar48,cols_08,rows_02);
      auVar57._4_60_ = extraout_var_02;
      auVar29 = vfmadd132ss_fma(auVar57._0_16_,ZEXT416((uint)fVar50),ZEXT416(0xc0400000));
      fVar51 = box_integral(iimage,row_02,iVar44,cols_08,cols_08);
      fVar52 = box_integral(iimage,row,iVar40,cols_08,cols_08);
      fVar53 = box_integral(iimage,row_02,iVar40,cols_08,cols_08);
      fVar50 = box_integral(iimage,row,iVar44,cols_08,cols_08);
      fVar50 = ((fVar52 + fVar51) - fVar53) - fVar50;
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar50 * -0.81)),
                                ZEXT416((uint)auVar28._0_4_),ZEXT416((uint)auVar29._0_4_));
      pfVar13[local_368 + lVar37] = auVar30._0_4_ * fVar70 * fVar70;
      pbVar12[lVar37 + local_368] = 0.0 <= auVar28._0_4_ + auVar29._0_4_;
      fVar50 = box_integral(iimage,row_03 + 1,iVar47 - iVar46,rows_03,rows);
      auVar58._0_4_ = box_integral(iimage,row_03 + 1,iVar47 - rows / 6,rows_03,cols_09);
      auVar58._4_60_ = extraout_var_03;
      auVar28 = vfmadd132ss_fma(auVar58._0_16_,ZEXT416((uint)fVar50),ZEXT416(0xc0400000));
      iVar48 = -cols_09 + 1 + iVar47;
      iVar40 = -cols_09 + iVar47;
      fVar50 = box_integral(iimage,iVar36 - iVar46,iVar48,rows,rows_03);
      auVar59._0_4_ = box_integral(iimage,iVar36 - rows / 6,iVar48,cols_09,rows_03);
      auVar59._4_60_ = extraout_var_04;
      auVar29 = vfmadd132ss_fma(auVar59._0_16_,ZEXT416((uint)fVar50),ZEXT416(0xc0400000));
      fVar51 = box_integral(iimage,row_03,iVar44,cols_09,cols_09);
      fVar52 = box_integral(iimage,row,iVar40,cols_09,cols_09);
      fVar53 = box_integral(iimage,row_03,iVar40,cols_09,cols_09);
      fVar50 = box_integral(iimage,row,iVar44,cols_09,cols_09);
      fVar50 = ((fVar52 + fVar51) - fVar53) - fVar50;
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar50 * -0.81)),
                                ZEXT416((uint)auVar28._0_4_),ZEXT416((uint)auVar29._0_4_));
      pfVar16[local_368 + lVar37] = auVar30._0_4_ * fVar71 * fVar71;
      pbVar14[lVar37 + local_368] = 0.0 <= auVar28._0_4_ + auVar29._0_4_;
      fVar50 = box_integral(iimage,row_04 + 1,iVar47 - iVar33,cols_05,rows_00);
      auVar60._0_4_ = box_integral(iimage,row_04 + 1,iVar47 - rows_00 / 6,cols_05,rows_08);
      auVar60._4_60_ = extraout_var_05;
      auVar28 = vfmadd132ss_fma(auVar60._0_16_,ZEXT416((uint)fVar50),ZEXT416(0xc0400000));
      iVar48 = -rows_08 + 1 + iVar47;
      iVar40 = -rows_08 + iVar47;
      fVar50 = box_integral(iimage,iVar36 - iVar33,iVar48,rows_00,cols_05);
      auVar61._0_4_ = box_integral(iimage,iVar36 - rows_00 / 6,iVar48,rows_08,cols_05);
      auVar61._4_60_ = extraout_var_06;
      auVar29 = vfmadd132ss_fma(auVar61._0_16_,ZEXT416((uint)fVar50),ZEXT416(0xc0400000));
      fVar51 = box_integral(iimage,row_04,iVar44,rows_08,rows_08);
      fVar52 = box_integral(iimage,row,iVar40,rows_08,rows_08);
      fVar53 = box_integral(iimage,row_04,iVar40,rows_08,rows_08);
      fVar50 = box_integral(iimage,row,iVar44,rows_08,rows_08);
      fVar50 = ((fVar52 + fVar51) - fVar53) - fVar50;
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar50 * -0.81)),
                                ZEXT416((uint)auVar28._0_4_),ZEXT416((uint)auVar29._0_4_));
      pfVar15[local_368 + lVar37] = auVar30._0_4_ * fVar72 * fVar72;
      pbVar17[lVar37 + local_368] = 0.0 <= auVar28._0_4_ + auVar29._0_4_;
      uVar39 = (uint)lVar37 | uVar38;
      if ((uVar39 & 1) == 0) {
        fVar50 = box_integral(iimage,row_05 + 1,iVar47 - iVar34,rows_04,cols_00);
        auVar62._0_4_ = box_integral(iimage,row_05 + 1,iVar47 - cols_00 / 6,rows_04,cols_10);
        auVar62._4_60_ = extraout_var_07;
        auVar29 = vfmadd213ss_fma(auVar62._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                  ZEXT416((uint)fVar50));
        iVar48 = -cols_10 + 1 + iVar47;
        iVar40 = -cols_10 + iVar47;
        fVar50 = box_integral(iimage,iVar36 - iVar34,iVar48,cols_00,rows_04);
        auVar63._0_4_ = box_integral(iimage,iVar36 - cols_00 / 6,iVar48,cols_10,rows_04);
        auVar63._4_60_ = extraout_var_08;
        auVar28 = vfmadd132ss_fma(auVar63._0_16_,ZEXT416((uint)fVar50),ZEXT416(0xc0400000));
        fVar51 = box_integral(iimage,row_05,iVar44,cols_10,cols_10);
        fVar52 = box_integral(iimage,row,iVar40,cols_10,cols_10);
        fVar53 = box_integral(iimage,row_05,iVar40,cols_10,cols_10);
        fVar50 = box_integral(iimage,row,iVar44,cols_10,cols_10);
        fVar50 = ((fVar52 + fVar51) - fVar53) - fVar50;
        auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar50 * -0.81)),
                                  ZEXT416((uint)auVar29._0_4_),ZEXT416((uint)auVar28._0_4_));
        pfVar18[iVar41] = auVar30._0_4_ * fVar73 * fVar73;
        pbVar19[iVar41] = 0.0 <= auVar29._0_4_ + auVar28._0_4_;
        fVar50 = box_integral(iimage,row_06 + 1,iVar47 - iVar45,rows_05,cols_02);
        auVar64._0_4_ = box_integral(iimage,row_06 + 1,iVar47 - cols_02 / 6,rows_05,cols_11);
        auVar64._4_60_ = extraout_var_09;
        auVar28 = vfmadd132ss_fma(auVar64._0_16_,ZEXT416((uint)fVar50),ZEXT416(0xc0400000));
        iVar48 = -cols_11 + 1 + iVar47;
        iVar40 = -cols_11 + iVar47;
        fVar50 = box_integral(iimage,iVar36 - iVar45,iVar48,cols_02,rows_05);
        auVar65._0_4_ = box_integral(iimage,iVar36 - cols_02 / 6,iVar48,cols_11,rows_05);
        auVar65._4_60_ = extraout_var_10;
        auVar29 = vfmadd132ss_fma(auVar65._0_16_,ZEXT416((uint)fVar50),ZEXT416(0xc0400000));
        fVar51 = box_integral(iimage,row_06,iVar44,cols_11,cols_11);
        fVar52 = box_integral(iimage,row,iVar40,cols_11,cols_11);
        fVar53 = box_integral(iimage,row_06,iVar40,cols_11,cols_11);
        fVar50 = box_integral(iimage,row,iVar44,cols_11,cols_11);
        fVar50 = ((fVar52 + fVar51) - fVar53) - fVar50;
        auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar50 * -0.81)),
                                  ZEXT416((uint)auVar28._0_4_),ZEXT416((uint)auVar29._0_4_));
        pfVar20[iVar41] = auVar30._0_4_ * fVar74 * fVar74;
        pbVar21[iVar41] = 0.0 <= auVar28._0_4_ + auVar29._0_4_;
        iVar41 = iVar41 + 1;
        if ((uVar39 & 2) == 0) {
          fVar50 = box_integral(iimage,row_00 + 1,iVar47 - iVar43,rows_06,cols_03);
          auVar66._0_4_ = box_integral(iimage,row_00 + 1,iVar47 - cols_03 / 6,rows_06,cols_12);
          auVar66._4_60_ = extraout_var_11;
          auVar29 = vfmadd213ss_fma(auVar66._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)fVar50));
          iVar48 = -cols_12 + 1 + iVar47;
          iVar40 = -cols_12 + iVar47;
          fVar50 = box_integral(iimage,iVar36 - iVar43,iVar48,cols_03,rows_06);
          auVar67._0_4_ = box_integral(iimage,iVar36 - cols_03 / 6,iVar48,cols_12,rows_06);
          auVar67._4_60_ = extraout_var_12;
          auVar28 = vfmadd132ss_fma(auVar67._0_16_,ZEXT416((uint)fVar50),ZEXT416(0xc0400000));
          fVar51 = box_integral(iimage,row_00,iVar44,cols_12,cols_12);
          fVar52 = box_integral(iimage,row,iVar40,cols_12,cols_12);
          fVar53 = box_integral(iimage,row_00,iVar40,cols_12,cols_12);
          fVar50 = box_integral(iimage,row,iVar44,cols_12,cols_12);
          fVar50 = ((fVar52 + fVar51) - fVar53) - fVar50;
          auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar50 * -0.81)),
                                    ZEXT416((uint)auVar29._0_4_),ZEXT416((uint)auVar28._0_4_));
          pfVar22[iVar42] = auVar30._0_4_ * fVar75 * fVar75;
          pbVar23[iVar42] = 0.0 <= auVar29._0_4_ + auVar28._0_4_;
          fVar50 = box_integral(iimage,row_07 + 1,iVar47 - iVar35,rows_07,cols_04);
          auVar68._0_4_ = box_integral(iimage,row_07 + 1,iVar47 - cols_04 / 6,rows_07,cols_06);
          auVar68._4_60_ = extraout_var_13;
          auVar28 = vfmadd132ss_fma(auVar68._0_16_,ZEXT416((uint)fVar50),ZEXT416(0xc0400000));
          iVar48 = -cols_06 + 1 + iVar47;
          iVar40 = -cols_06 + iVar47;
          fVar50 = box_integral(iimage,iVar36 - iVar35,iVar48,cols_04,rows_07);
          auVar69._0_4_ = box_integral(iimage,iVar36 - cols_04 / 6,iVar48,cols_06,rows_07);
          auVar69._4_60_ = extraout_var_14;
          auVar29 = vfmadd132ss_fma(auVar69._0_16_,ZEXT416((uint)fVar50),ZEXT416(0xc0400000));
          fVar51 = box_integral(iimage,row_07,iVar44,cols_06,cols_06);
          fVar52 = box_integral(iimage,row,iVar40,cols_06,cols_06);
          fVar53 = box_integral(iimage,row_07,iVar40,cols_06,cols_06);
          fVar50 = box_integral(iimage,row,iVar44,cols_06,cols_06);
          fVar50 = ((fVar52 + fVar51) - fVar53) - fVar50;
          auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar50 * -0.81)),
                                    ZEXT416((uint)auVar28._0_4_),ZEXT416((uint)auVar29._0_4_));
          pfVar24[iVar42] = auVar30._0_4_ * fVar76 * fVar76;
          pbVar25[iVar42] = 0.0 <= auVar28._0_4_ + auVar29._0_4_;
          iVar42 = iVar42 + 1;
        }
      }
      iVar47 = iVar47 + iVar1;
    }
    local_368 = local_368 + lVar37;
  }
  return;
}

Assistant:

void compute_response_layers_at_once(struct fasthessian* fh) {
    /*
    TODO: (valentin) add index precomputation as in compute_response_layer_precompute

    optimizations:
        - precompute inv_area_squared as in compute_response_layer_precompute
        - computes all 8 response layers at once, gives same results as base implementation


    Results:
        - slower than before :(
        - valgrind reports no improvement for l1 misses, i.e. locality is not improved as expected
            guess due to different filter sizes always accesing different cachelines
            need to be smarter about computation order to gain benefit (i.e. same mem addresses are actually accessed at once)
    */
    float Dxx0, Dyy0, Dxy0;
    float Dxx1, Dyy1, Dxy1;
    float Dxx2, Dyy2, Dxy2;
    float Dxx3, Dyy3, Dxy3;
    float Dxx4, Dyy4, Dxy4;
    float Dxx5, Dyy5, Dxy5;
    float Dxx6, Dyy6, Dxy6;
    float Dxx7, Dyy7, Dxy7;

    int x, y;
    int step = fh->step;
    struct integral_image* iimage = fh->iimage;

    // step == 1: 0,1,2,3
    // step == 2: 4,5
    // step == 4: 6,7

    struct response_layer *layer0 = fh->response_map[0];  // step0 == step
    struct response_layer *layer1 = fh->response_map[1];  // step1 == step
    struct response_layer *layer2 = fh->response_map[2];  // step2 == step
    struct response_layer *layer3 = fh->response_map[3];  // step3 == step

    struct response_layer *layer4 = fh->response_map[4];  // step4 == 2*step
    struct response_layer *layer5 = fh->response_map[5];  // step5 == 2*step

    struct response_layer *layer6 = fh->response_map[6];  // step6 == 4*step
    struct response_layer *layer7 = fh->response_map[7];  // step7 == 4*step

    float *response0 = layer0->response;
    float *response1 = layer1->response;
    float *response2 = layer2->response;
    float *response3 = layer3->response;
    float *response4 = layer4->response;
    float *response5 = layer5->response;
    float *response6 = layer6->response;
    float *response7 = layer7->response;

    bool *laplacian0 = layer0->laplacian;
    bool *laplacian1 = layer1->laplacian;
    bool *laplacian2 = layer2->laplacian;
    bool *laplacian3 = layer3->laplacian;
    bool *laplacian4 = layer4->laplacian;
    bool *laplacian5 = layer5->laplacian;
    bool *laplacian6 = layer6->laplacian;
    bool *laplacian7 = layer7->laplacian;

    int filter_size0 = layer0->filter_size;
    int filter_size1 = layer1->filter_size;
    int filter_size2 = layer2->filter_size;
    int filter_size3 = layer3->filter_size;
    int filter_size4 = layer4->filter_size;
    int filter_size5 = layer5->filter_size;
    int filter_size6 = layer6->filter_size;
    int filter_size7 = layer7->filter_size;

    int height = layer0->height;
    int width = layer0->width;

    int lobe0 = filter_size0/3;
    int lobe1 = filter_size1/3;
    int lobe2 = filter_size2/3;
    int lobe3 = filter_size3/3;
    int lobe4 = filter_size4/3;
    int lobe5 = filter_size5/3;
    int lobe6 = filter_size6/3;
    int lobe7 = filter_size7/3;

    int border0 = (filter_size0-1)/2;
    int border1 = (filter_size1-1)/2;
    int border2 = (filter_size2-1)/2;
    int border3 = (filter_size3-1)/2;
    int border4 = (filter_size4-1)/2;
    int border5 = (filter_size5-1)/2;
    int border6 = (filter_size6-1)/2;
    int border7 = (filter_size7-1)/2;

    float inv_area0 = 1.f/(filter_size0*filter_size0);
    float inv_area1 = 1.f/(filter_size1*filter_size1);
    float inv_area2 = 1.f/(filter_size2*filter_size2);
    float inv_area3 = 1.f/(filter_size3*filter_size3);
    float inv_area4 = 1.f/(filter_size4*filter_size4);
    float inv_area5 = 1.f/(filter_size5*filter_size5);
    float inv_area6 = 1.f/(filter_size6*filter_size6);
    float inv_area7 = 1.f/(filter_size7*filter_size7);

    float inv_area_squared0 = (inv_area0*inv_area0);
    float inv_area_squared1 = (inv_area1*inv_area1);
    float inv_area_squared2 = (inv_area2*inv_area2);
    float inv_area_squared3 = (inv_area3*inv_area3);
    float inv_area_squared4 = (inv_area4*inv_area4);
    float inv_area_squared5 = (inv_area5*inv_area5);
    float inv_area_squared6 = (inv_area6*inv_area6);
    float inv_area_squared7 = (inv_area7*inv_area7);


    for (int i = 0, ind = 0, ind2 = 0, ind4 = 0; i < height; ++i) {
        for (int j = 0; j < width; ++j, ind++) {
            // Image coordinates
            x = i * step;
            y = j * step;

            // layer0
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx0 = box_integral(iimage, x - lobe0 + 1, y - border0, 2 * lobe0 - 1, filter_size0) -
                   3 * box_integral(iimage, x - lobe0 + 1, y - lobe0 / 2, 2 * lobe0 - 1, lobe0);
            Dyy0 = box_integral(iimage, x - border0, y - lobe0 + 1, filter_size0, 2 * lobe0 - 1) -
                   3 * box_integral(iimage, x - lobe0 / 2, y - lobe0 + 1, lobe0, 2 * lobe0 - 1);
            Dxy0 = box_integral(iimage, x - lobe0, y + 1, lobe0, lobe0) +
                   box_integral(iimage, x + 1, y - lobe0, lobe0, lobe0) -
                   box_integral(iimage, x - lobe0, y - lobe0, lobe0, lobe0) -
                   box_integral(iimage, x + 1, y + 1, lobe0, lobe0);

            // Normalize Responses with inverse area
            // Dxx0 *= inv_area0;
            // Dyy0 *= inv_area0;
            // Dxy0 *= inv_area0;

            // Calculate Determinant
            response0[ind] = inv_area_squared0*(Dxx0 * Dyy0 - 0.81f * Dxy0 * Dxy0);

            // Calculate Laplacian
            laplacian0[ind] = (Dxx0 + Dyy0 >= 0 ? true : false);


            // layer1
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx1 = box_integral(iimage, x - lobe1 + 1, y - border1, 2 * lobe1 - 1, filter_size1) -
                   3 * box_integral(iimage, x - lobe1 + 1, y - lobe1 / 2, 2 * lobe1 - 1, lobe1);
            Dyy1 = box_integral(iimage, x - border1, y - lobe1 + 1, filter_size1, 2 * lobe1 - 1) -
                   3 * box_integral(iimage, x - lobe1 / 2, y - lobe1 + 1, lobe1, 2 * lobe1 - 1);
            Dxy1 = box_integral(iimage, x - lobe1, y + 1, lobe1, lobe1) +
                   box_integral(iimage, x + 1, y - lobe1, lobe1, lobe1) -
                   box_integral(iimage, x - lobe1, y - lobe1, lobe1, lobe1) -
                   box_integral(iimage, x + 1, y + 1, lobe1, lobe1);

            // Normalize Responses with inverse area
            // Dxx1 *= inv_area1;
            // Dyy1 *= inv_area1;
            // Dxy1 *= inv_area1;

            // Calculate Determinant
            response1[ind] = inv_area_squared1*(Dxx1 * Dyy1 - 0.81f * Dxy1 * Dxy1);

            // Calculate Laplacian
            laplacian1[ind] = (Dxx1 + Dyy1 >= 0 ? true : false);


            // layer2
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx2 = box_integral(iimage, x - lobe2 + 1, y - border2, 2 * lobe2 - 1, filter_size2) -
                   3 * box_integral(iimage, x - lobe2 + 1, y - lobe2 / 2, 2 * lobe2 - 1, lobe2);
            Dyy2 = box_integral(iimage, x - border2, y - lobe2 + 1, filter_size2, 2 * lobe2 - 1) -
                   3 * box_integral(iimage, x - lobe2 / 2, y - lobe2 + 1, lobe2, 2 * lobe2 - 1);
            Dxy2 = box_integral(iimage, x - lobe2, y + 1, lobe2, lobe2) +
                   box_integral(iimage, x + 1, y - lobe2, lobe2, lobe2) -
                   box_integral(iimage, x - lobe2, y - lobe2, lobe2, lobe2) -
                   box_integral(iimage, x + 1, y + 1, lobe2, lobe2);

            // Normalize Responses with inverse area
            // Dxx2 *= inv_area2;
            // Dyy2 *= inv_area2;
            // Dxy2 *= inv_area2;

            // Calculate Determinant
            response2[ind] = inv_area_squared2*(Dxx2 * Dyy2 - 0.81f * Dxy2 * Dxy2);

            // Calculate Laplacian
            laplacian2[ind] = (Dxx2 + Dyy2 >= 0 ? true : false);


            // layer3
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx3 = box_integral(iimage, x - lobe3 + 1, y - border3, 2*lobe3 - 1, filter_size3)
                    - 3 * box_integral(iimage, x - lobe3 + 1, y - lobe3 / 2, 2*lobe3 - 1, lobe3);
            Dyy3 = box_integral(iimage, x - border3, y - lobe3 + 1, filter_size3, 2*lobe3 - 1)
                    - 3 * box_integral(iimage, x - lobe3 / 2, y - lobe3 + 1, lobe3, 2*lobe3 - 1);
            Dxy3 = box_integral(iimage, x - lobe3, y + 1, lobe3, lobe3)
                    + box_integral(iimage, x + 1, y - lobe3, lobe3, lobe3)
                    - box_integral(iimage, x - lobe3, y - lobe3, lobe3, lobe3)
                    - box_integral(iimage, x + 1, y + 1, lobe3, lobe3);

            // Normalize Responses with inverse area
            // Dxx3 *= inv_area3;
            // Dyy3 *= inv_area3;
            // Dxy3 *= inv_area3;

            // Calculate Determinant
            response3[ind] = inv_area_squared3*(Dxx3 * Dyy3 - 0.81f * Dxy3 * Dxy3);

            // Calculate Laplacian
            laplacian3[ind] = (Dxx3 + Dyy3 >= 0 ? true : false);


            // 2*step
            if (i % 2 == 0 && j % 2 == 0) {
                // layer4
                // Calculate Dxx, Dyy, Dxy with Box Filter
                Dxx4 = box_integral(iimage, x - lobe4 + 1, y - border4, 2*lobe4 - 1, filter_size4)
                        - 3 * box_integral(iimage, x - lobe4 + 1, y - lobe4 / 2, 2*lobe4 - 1, lobe4);
                Dyy4 = box_integral(iimage, x - border4, y - lobe4 + 1, filter_size4, 2*lobe4 - 1)
                        - 3 * box_integral(iimage, x - lobe4 / 2, y - lobe4 + 1, lobe4, 2*lobe4 - 1);
                Dxy4 = box_integral(iimage, x - lobe4, y + 1, lobe4, lobe4)
                        + box_integral(iimage, x + 1, y - lobe4, lobe4, lobe4)
                        - box_integral(iimage, x - lobe4, y - lobe4, lobe4, lobe4)
                        - box_integral(iimage, x + 1, y + 1, lobe4, lobe4);

                // Normalize Responses with inverse area
                // Dxx4 *= inv_area4;
                // Dyy4 *= inv_area4;
                // Dxy4 *= inv_area4;

                // Calculate Determinant
                response4[ind2] = inv_area_squared4*(Dxx4 * Dyy4 - 0.81f * Dxy4 * Dxy4);

                // Calculate Laplacian
                laplacian4[ind2] = (Dxx4 + Dyy4 >= 0 ? true : false);


                // layer5
                // Calculate Dxx, Dyy, Dxy with Box Filter
                Dxx5 = box_integral(iimage, x - lobe5 + 1, y - border5, 2*lobe5 - 1, filter_size5)
                        - 3 * box_integral(iimage, x - lobe5 + 1, y - lobe5 / 2, 2*lobe5 - 1, lobe5);
                Dyy5 = box_integral(iimage, x - border5, y - lobe5 + 1, filter_size5, 2*lobe5 - 1)
                        - 3 * box_integral(iimage, x - lobe5 / 2, y - lobe5 + 1, lobe5, 2*lobe5 - 1);
                Dxy5 = box_integral(iimage, x - lobe5, y + 1, lobe5, lobe5)
                        + box_integral(iimage, x + 1, y - lobe5, lobe5, lobe5)
                        - box_integral(iimage, x - lobe5, y - lobe5, lobe5, lobe5)
                        - box_integral(iimage, x + 1, y + 1, lobe5, lobe5);

                // Normalize Responses with inverse area
                // Dxx5 *= inv_area5;
                // Dyy5 *= inv_area5;
                // Dxy5 *= inv_area5;

                // Calculate Determinant
                response5[ind2] = inv_area_squared5*(Dxx5 * Dyy5 - 0.81f * Dxy5 * Dxy5);

                // Calculate Laplacian
                laplacian5[ind2] = (Dxx5 + Dyy5 >= 0 ? true : false);


                ind2++;

                // 4*step
                if (i % 4 == 0 && j % 4 == 0) {
                    // layer6
                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    Dxx6 = box_integral(iimage, x - lobe6 + 1, y - border6, 2*lobe6 - 1, filter_size6)
                            - 3 * box_integral(iimage, x - lobe6 + 1, y - lobe6 / 2, 2*lobe6 - 1, lobe6);
                    Dyy6 = box_integral(iimage, x - border6, y - lobe6 + 1, filter_size6, 2*lobe6 - 1)
                            - 3 * box_integral(iimage, x - lobe6 / 2, y - lobe6 + 1, lobe6, 2*lobe6 - 1);
                    Dxy6 = box_integral(iimage, x - lobe6, y + 1, lobe6, lobe6)
                            + box_integral(iimage, x + 1, y - lobe6, lobe6, lobe6)
                            - box_integral(iimage, x - lobe6, y - lobe6, lobe6, lobe6)
                            - box_integral(iimage, x + 1, y + 1, lobe6, lobe6);

                    // Normalize Responses with inverse area
                    // Dxx6 *= inv_area6;
                    // Dyy6 *= inv_area6;
                    // Dxy6 *= inv_area6;

                    // Calculate Determinant
                    response6[ind4] = inv_area_squared6*(Dxx6 * Dyy6 - 0.81f * Dxy6 * Dxy6);

                    // Calculate Laplacian
                    laplacian6[ind4] = (Dxx6 + Dyy6 >= 0 ? true : false);


                    // layer7
                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    Dxx7 = box_integral(iimage, x - lobe7 + 1, y - border7, 2*lobe7 - 1, filter_size7)
                            - 3 * box_integral(iimage, x - lobe7 + 1, y - lobe7 / 2, 2*lobe7 - 1, lobe7);
                    Dyy7 = box_integral(iimage, x - border7, y - lobe7 + 1, filter_size7, 2*lobe7 - 1)
                            - 3 * box_integral(iimage, x - lobe7 / 2, y - lobe7 + 1, lobe7, 2*lobe7 - 1);
                    Dxy7 = box_integral(iimage, x - lobe7, y + 1, lobe7, lobe7)
                            + box_integral(iimage, x + 1, y - lobe7, lobe7, lobe7)
                            - box_integral(iimage, x - lobe7, y - lobe7, lobe7, lobe7)
                            - box_integral(iimage, x + 1, y + 1, lobe7, lobe7);

                    // Normalize Responses with inverse area
                    // Dxx7 *= inv_area7;
                    // Dyy7 *= inv_area7;
                    // Dxy7 *= inv_area7;

                    // Calculate Determinant
                    response7[ind4] = inv_area_squared7*(Dxx7 * Dyy7 - 0.81f * Dxy7 * Dxy7);

                    // Calculate Laplacian
                    laplacian7[ind4] = (Dxx7 + Dyy7 >= 0 ? true : false);


                    ind4++;
                }
            }

            // template for search and replace J to layer number
            // // layerJ
            // // Calculate Dxx, Dyy, Dxy with Box Filter
            // DxxJ = box_integral(iimage, x - lobeJ + 1, y - borderJ, 2*lobeJ - 1, filter_sizeJ)
            //         - 3 * box_integral(iimage, x - lobeJ + 1, y - lobeJ / 2, 2*lobeJ - 1, lobeJ);
            // DyyJ = box_integral(iimage, x - borderJ, y - lobeJ + 1, filter_sizeJ, 2*lobeJ - 1)
            //         - 3 * box_integral(iimage, x - lobeJ / 2, y - lobeJ + 1, lobeJ, 2*lobeJ - 1);
            // DxyJ = box_integral(iimage, x - lobeJ, y + 1, lobeJ, lobeJ)
            //         + box_integral(iimage, x + 1, y - lobeJ, lobeJ, lobeJ)
            //         - box_integral(iimage, x - lobeJ, y - lobeJ, lobeJ, lobeJ)
            //         - box_integral(iimage, x + 1, y + 1, lobeJ, lobeJ);

            // // Normalize Responses with inverse area
            // DxxJ *= inv_areaJ;
            // DyyJ *= inv_areaJ;
            // DxyJ *= inv_areaJ;

            // // Calculate Determinant
            // responseJ[ind] = DxxJ * DyyJ - 0.81f * DxyJ * DxyJ;

            // // Calculate Laplacian
            // laplacianJ[ind] = (DxxJ + DyyJ >= 0 ? true : false);
        }
    }

}